

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * strchr(char *__s,int __c)

{
  char cVar1;
  
  do {
    cVar1 = *__s;
    if ((char)__c == cVar1) {
      return __s;
    }
    __s = __s + 1;
  } while (cVar1 != '\0');
  return (char *)0x0;
}

Assistant:

char *strchr(const char *s, int c) {
    const char c_ = (char)c;
    do {
        if (*s == c_) {
            return (char *)s;
        }
    } while (*s++ != '\0');
    return NULL;
}